

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O3

bool cb_eval(ggml_tensor *t,bool ask,void *user_data)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = strncmp(t->name,"l_out",5);
  if (iVar1 == 0 && !ask) {
    bVar2 = true;
    if (t->ne[1] == (long)*(int *)((long)user_data + 0xc)) {
      callback_data::save_tensor_for_layer((callback_data *)user_data,t);
    }
  }
  else {
    bVar2 = !ask || iVar1 == 0;
  }
  return bVar2;
}

Assistant:

static bool cb_eval(struct ggml_tensor * t, bool ask, void * user_data) {
    auto * cb_data = (callback_data *) user_data;
    static const char * l_out_name = "l_out";
    const bool is_l_out = strncmp(t->name, l_out_name, strlen(l_out_name)) == 0;

    if (ask) {
        return is_l_out;
    }

    if (!is_l_out || t->ne[1] != cb_data->n_tokens) {
        return true;
    }

    // save the tensor to current context
    cb_data->save_tensor_for_layer(t);
    return true;
}